

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

Maybe<kj::Own<capnp::ClientHook>_> * __thiscall
kj::Vector<kj::Maybe<kj::Own<capnp::ClientHook>>>::add<kj::Own<capnp::ClientHook>>
          (Vector<kj::Maybe<kj::Own<capnp::ClientHook>>> *this,Own<capnp::ClientHook> *params)

{
  ClientHook *pCVar1;
  Maybe<kj::Own<capnp::ClientHook>_> *pMVar2;
  
  pMVar2 = *(Maybe<kj::Own<capnp::ClientHook>_> **)(this + 8);
  if (pMVar2 == *(Maybe<kj::Own<capnp::ClientHook>_> **)(this + 0x10)) {
    Vector<kj::Maybe<kj::Own<capnp::ClientHook>_>_>::grow
              ((Vector<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *)this,0);
    pMVar2 = *(Maybe<kj::Own<capnp::ClientHook>_> **)(this + 8);
  }
  pCVar1 = params->ptr;
  (pMVar2->ptr).disposer = params->disposer;
  (pMVar2->ptr).ptr = pCVar1;
  params->ptr = (ClientHook *)0x0;
  *(Maybe<kj::Own<capnp::ClientHook>_> **)(this + 8) = pMVar2 + 1;
  return pMVar2;
}

Assistant:

inline T& add(Params&&... params) {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }